

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# child-typer.h
# Opt level: O0

void __thiscall
wasm::ChildTyper<wasm::IRBuilder::ChildPopper::ConstraintCollector>::handleCall<wasm::Call>
          (ChildTyper<wasm::IRBuilder::ChildPopper::ConstraintCollector> *this,Call *curr,
          Type params)

{
  size_t sVar1;
  size_t sVar2;
  Expression **childp;
  Type *pTVar3;
  ulong local_28;
  size_t i;
  Call *curr_local;
  ChildTyper<wasm::IRBuilder::ChildPopper::ConstraintCollector> *this_local;
  Type params_local;
  
  this_local = (ChildTyper<wasm::IRBuilder::ChildPopper::ConstraintCollector> *)params.id;
  sVar1 = wasm::Type::size((Type *)&this_local);
  sVar2 = ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>::size
                    (&(curr->operands).
                      super_ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>);
  if (sVar1 == sVar2) {
    local_28 = 0;
    while( true ) {
      sVar1 = wasm::Type::size((Type *)&this_local);
      if (sVar1 <= local_28) break;
      childp = ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>::operator[]
                         (&(curr->operands).
                           super_ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>
                          ,local_28);
      pTVar3 = wasm::Type::operator[]((Type *)&this_local,local_28);
      note(this,childp,(Type)pTVar3->id);
      local_28 = local_28 + 1;
    }
    return;
  }
  __assert_fail("params.size() == curr->operands.size()",
                "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/ir/child-typer.h"
                ,0xa2,
                "void wasm::ChildTyper<wasm::IRBuilder::ChildPopper::ConstraintCollector>::handleCall(T *, Type) [Subtype = wasm::IRBuilder::ChildPopper::ConstraintCollector, T = wasm::Call]"
               );
}

Assistant:

void handleCall(T* curr, Type params) {
    assert(params.size() == curr->operands.size());
    for (size_t i = 0; i < params.size(); ++i) {
      note(&curr->operands[i], params[i]);
    }
  }